

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void DC8uvNoTop_SSE2(uint8_t *dst)

{
  int dc0;
  uint uVar1;
  long lVar2;
  
  uVar1 = 4;
  for (lVar2 = -1; lVar2 != 0xff; lVar2 = lVar2 + 0x20) {
    uVar1 = uVar1 + dst[lVar2];
  }
  Put8x8uv_SSE2((uint8_t)(uVar1 >> 3),dst);
  return;
}

Assistant:

static void DC8uvNoTop_SSE2(uint8_t* dst) {  // DC with no top samples
  int dc0 = 4;
  int i;
  for (i = 0; i < 8; ++i) {
    dc0 += dst[-1 + i * BPS];
  }
  Put8x8uv_SSE2(dc0 >> 3, dst);
}